

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

void __thiscall kj::AsyncIoStreamWithGuards::write(AsyncIoStreamWithGuards *this)

{
  size_t in_RCX;
  void *in_RDX;
  int in_ESI;
  
  write(this,in_ESI + -8,in_RDX,in_RCX);
  return;
}

Assistant:

Promise<void> write(ArrayPtr<const ArrayPtr<const byte>> pieces) override {
    if (writeGuardReleased) {
      return inner->write(pieces);
    } else {
      return writeGuard.addBranch().then([this, pieces]() {
        return inner->write(pieces);
      });
    }
  }